

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomUniformLikeLayerParams::MergeFrom
          (RandomUniformLikeLayerParams *this,RandomUniformLikeLayerParams *from)

{
  LogMessage *other;
  int64_t iVar1;
  float fVar2;
  uint32_t raw_maxval;
  float tmp_maxval;
  uint32_t raw_minval;
  float tmp_minval;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  RandomUniformLikeLayerParams *local_18;
  RandomUniformLikeLayerParams *from_local;
  RandomUniformLikeLayerParams *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xb873);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&tmp_minval + 3),other)
    ;
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = _internal_seed(local_18);
  if (iVar1 != 0) {
    iVar1 = _internal_seed(local_18);
    _internal_set_seed(this,iVar1);
  }
  fVar2 = _internal_minval(local_18);
  if (fVar2 != 0.0) {
    fVar2 = _internal_minval(local_18);
    _internal_set_minval(this,fVar2);
  }
  fVar2 = _internal_maxval(local_18);
  if (fVar2 != 0.0) {
    fVar2 = _internal_maxval(local_18);
    _internal_set_maxval(this,fVar2);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void RandomUniformLikeLayerParams::MergeFrom(const RandomUniformLikeLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.RandomUniformLikeLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_seed() != 0) {
    _internal_set_seed(from._internal_seed());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_minval = from._internal_minval();
  uint32_t raw_minval;
  memcpy(&raw_minval, &tmp_minval, sizeof(tmp_minval));
  if (raw_minval != 0) {
    _internal_set_minval(from._internal_minval());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_maxval = from._internal_maxval();
  uint32_t raw_maxval;
  memcpy(&raw_maxval, &tmp_maxval, sizeof(tmp_maxval));
  if (raw_maxval != 0) {
    _internal_set_maxval(from._internal_maxval());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}